

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscrete.cpp
# Opt level: O0

JointPolicyDiscrete * __thiscall
JointPolicyDiscrete::operator=(JointPolicyDiscrete *this,JointPolicyDiscrete *o)

{
  JointPolicyDiscrete *in_RSI;
  JointPolicyDiscrete *in_RDI;
  JointPolicyDiscrete *this_00;
  
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    JointPolicy::operator=(&in_RDI->super_JointPolicy,&in_RSI->super_JointPolicy);
    in_RDI->_m_indexDomCat = in_RSI->_m_indexDomCat;
    in_RDI->_m_PTPD = in_RSI->_m_PTPD;
    boost::shared_ptr<const_Interface_ProblemToPolicyDiscrete>::operator=
              ((shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)this_00,
               (shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)in_RSI);
  }
  return in_RDI;
}

Assistant:

JointPolicyDiscrete&
JointPolicyDiscrete::operator= (const JointPolicyDiscrete& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyDiscrete::operator= (const JointPolicyDiscrete& o) called"<<endl;
#endif
    if (this == &o) return *this;   // Gracefully handle self assignment
    JointPolicy::operator= ( o );   //call parent
    _m_indexDomCat = o._m_indexDomCat;
    _m_PTPD = o._m_PTPD;
    _m_PTPDshared = o._m_PTPDshared;
    return *this;
}